

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynBase * ParseTernaryExpr(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  SynConditional *condition;
  SynBase *trueBlock;
  undefined4 extraout_var;
  Lexeme *pLVar2;
  SynBase *falseBlock;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  condition = (SynConditional *)ParseArithmetic(ctx);
  if (condition == (SynConditional *)0x0) {
    condition = (SynConditional *)0x0;
  }
  else {
    begin = ctx->currentLexeme;
    pLVar2 = begin;
    while (pLVar2->type == lex_questionmark) {
      ctx->currentLexeme = pLVar2 + 1;
      trueBlock = ParseAssignment(ctx);
      if (trueBlock == (SynBase *)0x0) {
        anon_unknown.dwarf_1519a::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression not found after \'?\'");
        iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        trueBlock = (SynBase *)CONCAT44(extraout_var,iVar1);
        pLVar2 = ParseContext::Previous(ctx);
        SynError::SynError((SynError *)trueBlock,begin,pLVar2);
      }
      anon_unknown.dwarf_1519a::CheckConsume
                (ctx,lex_colon,"ERROR: \':\' not found after expression in ternary operator");
      falseBlock = ParseAssignment(ctx);
      if (falseBlock == (SynBase *)0x0) {
        anon_unknown.dwarf_1519a::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression not found after \':\'");
        iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        falseBlock = (SynBase *)CONCAT44(extraout_var_00,iVar1);
        pLVar2 = ParseContext::Previous(ctx);
        SynError::SynError((SynError *)falseBlock,begin,pLVar2);
      }
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
      pLVar2 = ParseContext::Previous(ctx);
      SynConditional::SynConditional
                ((SynConditional *)CONCAT44(extraout_var_01,iVar1),begin,pLVar2,
                 &condition->super_SynBase,trueBlock,falseBlock);
      condition = (SynConditional *)CONCAT44(extraout_var_01,iVar1);
      pLVar2 = ctx->currentLexeme;
    }
  }
  return &condition->super_SynBase;
}

Assistant:

SynBase* ParseTernaryExpr(ParseContext &ctx)
{
	if(SynBase *value = ParseArithmetic(ctx))
	{
		Lexeme *pos = ctx.currentLexeme;

		while(ctx.Consume(lex_questionmark))
		{
			SynBase *trueBlock = ParseAssignment(ctx);

			if(!trueBlock)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after '?'");

				trueBlock = new (ctx.get<SynError>()) SynError(pos, ctx.Previous());
			}

			CheckConsume(ctx, lex_colon, "ERROR: ':' not found after expression in ternary operator");

			SynBase *falseBlock = ParseAssignment(ctx);

			if(!falseBlock)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after ':'");

				falseBlock = new (ctx.get<SynError>()) SynError(pos, ctx.Previous());
			}

			value = new (ctx.get<SynConditional>()) SynConditional(pos, ctx.Previous(), value, trueBlock, falseBlock);
		}

		return value;
	}

	return NULL;
}